

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_ac3::ndiPSTATHelper(ndicapi *pol,char *command,char *commandReply)

{
  bool bVar1;
  int local_3c;
  int activeCount;
  int passiveCount;
  int j;
  int i;
  char *writePointer;
  unsigned_long mode;
  char *commandReply_local;
  char *command_local;
  ndicapi *pol_local;
  
  writePointer = (char *)0x1;
  if (((command[5] == ':') && (command[10] != '\r')) ||
     ((command[5] == ' ' && (command[6] != '\r')))) {
    writePointer = (char *)ndiHexToUnsignedLong(command + 6,4);
  }
  mode = (unsigned_long)commandReply;
  for (passiveCount = 0; passiveCount < 3; passiveCount = passiveCount + 1) {
    if (((ulong)writePointer & 1) != 0) {
      activeCount = 0;
      _j = pol->PstatBasic + passiveCount;
      while( true ) {
        bVar1 = false;
        if (activeCount < 0x20) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*_j)[0] = *(char *)mode;
        activeCount = activeCount + 1;
        _j = (char (*) [32])(*_j + 1);
        mode = mode + 1;
      }
      if (activeCount < 0x20) {
        (*_j)[0] = '\0';
      }
    }
    if (((ulong)writePointer & 2) != 0) {
      pol->PstatTesting[passiveCount][0] = '\0';
      activeCount = 0;
      _j = (char (*) [32])(pol->PstatTesting + passiveCount);
      while( true ) {
        bVar1 = false;
        if (activeCount < 8) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*(char (*) [8])_j)[0] = *(char *)mode;
        activeCount = activeCount + 1;
        _j = (char (*) [32])(*(char (*) [8])_j + 1);
        mode = mode + 1;
      }
    }
    if (((ulong)writePointer & 4) != 0) {
      pol->PstatPartNumber[passiveCount][0] = '\0';
      activeCount = 0;
      _j = (char (*) [32])(pol->PstatPartNumber + passiveCount);
      while( true ) {
        bVar1 = false;
        if (activeCount < 0x14) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*(char (*) [20])_j)[0] = *(char *)mode;
        activeCount = activeCount + 1;
        _j = (char (*) [32])(*(char (*) [20])_j + 1);
        mode = mode + 1;
      }
    }
    if (((ulong)writePointer & 8) != 0) {
      pol->PstatAccessories[passiveCount][0] = '\0';
      activeCount = 0;
      _j = (char (*) [32])(pol->PstatAccessories + passiveCount);
      while( true ) {
        bVar1 = false;
        if (activeCount < 2) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*(char (*) [2])_j)[0] = *(char *)mode;
        activeCount = activeCount + 1;
        _j = (char (*) [32])(*(char (*) [2])_j + 1);
        mode = mode + 1;
      }
    }
    if (((ulong)writePointer & 0x10) != 0) {
      pol->PstatMarkerType[passiveCount][0] = '\0';
      activeCount = 0;
      _j = (char (*) [32])(pol->PstatMarkerType + passiveCount);
      while( true ) {
        bVar1 = false;
        if (activeCount < 2) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*(char (*) [2])_j)[0] = *(char *)mode;
        activeCount = activeCount + 1;
        _j = (char (*) [32])(*(char (*) [2])_j + 1);
        mode = mode + 1;
      }
    }
    for (; '\x1f' < *(char *)mode; mode = mode + 1) {
    }
    if (*(char *)mode == '\n') {
      mode = mode + 1;
    }
  }
  if (((ulong)writePointer & 0x8000) != 0) {
    local_3c = 3;
    if (((ulong)writePointer & 0x2000) != 0) {
      local_3c = 9;
    }
    for (passiveCount = 0; passiveCount < local_3c; passiveCount = passiveCount + 1) {
      if (((ulong)writePointer & 1) != 0) {
        pol->PstatPassiveBasic[passiveCount][0] = '\0';
        activeCount = 0;
        _j = pol->PstatPassiveBasic + passiveCount;
        while( true ) {
          bVar1 = false;
          if (activeCount < 0x20) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*_j)[0] = *(char *)mode;
          activeCount = activeCount + 1;
          _j = (char (*) [32])(*_j + 1);
          mode = mode + 1;
        }
        if (activeCount < 0x20) {
          (*_j)[0] = '\0';
        }
      }
      if (((ulong)writePointer & 2) != 0) {
        pol->PstatPassiveTesting[passiveCount][0] = '\0';
        activeCount = 0;
        _j = (char (*) [32])(pol->PstatPassiveTesting + passiveCount);
        while( true ) {
          bVar1 = false;
          if (activeCount < 8) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*(char (*) [8])_j)[0] = *(char *)mode;
          activeCount = activeCount + 1;
          _j = (char (*) [32])(*(char (*) [8])_j + 1);
          mode = mode + 1;
        }
      }
      if (((ulong)writePointer & 4) != 0) {
        pol->PstatPassivePartNumber[passiveCount][0] = '\0';
        activeCount = 0;
        _j = (char (*) [32])(pol->PstatPassivePartNumber + passiveCount);
        while( true ) {
          bVar1 = false;
          if (activeCount < 0x14) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*(char (*) [20])_j)[0] = *(char *)mode;
          activeCount = activeCount + 1;
          _j = (char (*) [32])(*(char (*) [20])_j + 1);
          mode = mode + 1;
        }
      }
      if (((ulong)writePointer & 8) != 0) {
        pol->PstatPassiveAccessories[passiveCount][0] = '\0';
        activeCount = 0;
        _j = (char (*) [32])(pol->PstatPassiveAccessories + passiveCount);
        while( true ) {
          bVar1 = false;
          if (activeCount < 2) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*(char (*) [2])_j)[0] = *(char *)mode;
          activeCount = activeCount + 1;
          _j = (char (*) [32])(*(char (*) [2])_j + 1);
          mode = mode + 1;
        }
      }
      if (((ulong)writePointer & 0x10) != 0) {
        pol->PstatPassiveMarkerType[passiveCount][0] = '\0';
        activeCount = 0;
        _j = (char (*) [32])(pol->PstatPassiveMarkerType + passiveCount);
        while( true ) {
          bVar1 = false;
          if (activeCount < 2) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*(char (*) [2])_j)[0] = *(char *)mode;
          activeCount = activeCount + 1;
          _j = (char (*) [32])(*(char (*) [2])_j + 1);
          mode = mode + 1;
        }
      }
      for (; '\x1f' < *(char *)mode; mode = mode + 1) {
      }
      if (*(char *)mode == '\n') {
        mode = mode + 1;
      }
    }
  }
  return;
}

Assistant:

void ndiPSTATHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    char* writePointer;
    int i, j;
    int passiveCount, activeCount;

    // if the PSTAT command had a reply mode, read it
    if ((command[5] == ':' && command[10] != '\r') || (command[5] == ' ' && command[6] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[6], 4);
    }

    // always three active ports
    activeCount = 3;

    // information for each port is separated by a newline
    for (i = 0; i < activeCount; i++)
    {
      // basic tool information and port status
      if (mode & NDI_BASIC)
      {
        writePointer = pol->PstatBasic[i];
        for (j = 0; j < 32 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        // terminate if UNOCCUPIED
        if (j < 32)
        {
          *writePointer = '\0';
        }
      }

      // current testing
      if (mode & NDI_TESTING)
      {
        writePointer = pol->PstatTesting[i];
        *writePointer = '\0';
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // part number
      if (mode & NDI_PART_NUMBER)
      {
        writePointer = pol->PstatPartNumber[i];
        *writePointer = '\0';
        for (j = 0; j < 20 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // accessories
      if (mode & NDI_ACCESSORIES)
      {
        writePointer = pol->PstatAccessories[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // marker type
      if (mode & NDI_MARKER_TYPE)
      {
        writePointer = pol->PstatMarkerType[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // skip any other information that might be present
      while (*commandReply >= ' ')
      {
        commandReply++;
      }

      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    // if there is no passive information, stop here
    if (!(mode & NDI_PASSIVE))
    {
      return;
    }

    // in case there are 9 passive tools instead of just 3
    passiveCount = 3;
    if (mode & NDI_PASSIVE_EXTRA)
    {
      passiveCount = 9;
    }

    // information for each port is separated by a newline
    for (i = 0; i < passiveCount; i++)
    {
      // basic tool information and port status
      if (mode & NDI_BASIC)
      {
        writePointer = pol->PstatPassiveBasic[i];
        *writePointer = '\0';
        for (j = 0; j < 32 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        // terminate if UNOCCUPIED
        if (j < 32)
        {
          *writePointer = '\0';
        }
      }

      // current testing
      if (mode & NDI_TESTING)
      {
        writePointer = pol->PstatPassiveTesting[i];
        *writePointer = '\0';
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // part number
      if (mode & NDI_PART_NUMBER)
      {
        writePointer = pol->PstatPassivePartNumber[i];
        *writePointer = '\0';
        for (j = 0; j < 20 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // accessories
      if (mode & NDI_ACCESSORIES)
      {
        writePointer = pol->PstatPassiveAccessories[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // marker type
      if (mode & NDI_MARKER_TYPE)
      {
        writePointer = pol->PstatPassiveMarkerType[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // skip any other information that might be present
      while (*commandReply >= ' ')
      {
        commandReply++;
      }

      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }
  }